

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

int Abc_TtCountOnesInCofsFast_rec(word *pTruth,int iVar,int nWords,int *pStore)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint nWords_00;
  
  if (nWords == 1) {
    if (iVar != 5) {
      __assert_fail("iVar == 5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x217,"int Abc_TtCountOnesInCofsFast_rec(word *, int, int, int *)");
    }
    iVar1 = Abc_TtCountOnesInCofsFast6_rec(*pTruth,5,8,pStore);
    return iVar1;
  }
  if (nWords < 2) {
    __assert_fail("nWords > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                  ,0x21a,"int Abc_TtCountOnesInCofsFast_rec(word *, int, int, int *)");
  }
  if (iVar < 6) {
    __assert_fail("iVar > 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                  ,0x21b,"int Abc_TtCountOnesInCofsFast_rec(word *, int, int, int *)");
  }
  if ((*pTruth & 1) == 0) {
    uVar3 = 0;
    do {
      if (pTruth[uVar3] != 0) {
LAB_004fc74d:
        nWords_00 = (uint)nWords >> 1;
        iVar1 = Abc_TtCountOnesInCofsFast_rec(pTruth,iVar + -1,nWords_00,pStore);
        iVar2 = Abc_TtCountOnesInCofsFast_rec(pTruth + nWords_00,iVar + -1,nWords_00,pStore);
        pStore[(uint)iVar] = pStore[(uint)iVar] + iVar1;
        return iVar2 + iVar1;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)nWords != uVar3);
    iVar1 = 0;
  }
  else {
    uVar3 = 0;
    do {
      if (pTruth[uVar3] != 0xffffffffffffffff) goto LAB_004fc74d;
      uVar3 = uVar3 + 1;
    } while ((uint)nWords != uVar3);
    uVar3 = 0;
    do {
      pStore[uVar3] = pStore[uVar3] + nWords * 0x20;
      uVar3 = uVar3 + 1;
    } while (iVar + 1 != uVar3);
    iVar1 = nWords << 6;
  }
  return iVar1;
}

Assistant:

int Abc_TtCountOnesInCofsFast_rec( word * pTruth, int iVar, int nWords, int * pStore )
{
    int nMints0, nMints1;
    if ( nWords == 1 )
    {
        assert( iVar == 5 );
        return Abc_TtCountOnesInCofsFast6_rec( pTruth[0], iVar, 8, pStore );
    }
    assert( nWords > 1 );
    assert( iVar > 5 );
    if ( pTruth[0] & 1 )
    {
        if ( Abc_TtIsConst1( pTruth, nWords ) )
        {
            int i;
            for ( i = 0; i <= iVar; i++ )
                pStore[i] += nWords * 32;
            return nWords * 64;
        }
    }
    else 
    {
        if ( Abc_TtIsConst0( pTruth, nWords ) )
            return 0;
    }
    nMints0 = Abc_TtCountOnesInCofsFast_rec( pTruth,            iVar - 1, nWords/2, pStore );
    nMints1 = Abc_TtCountOnesInCofsFast_rec( pTruth + nWords/2, iVar - 1, nWords/2, pStore );
    pStore[iVar] += nMints0;
    return nMints0 + nMints1;
}